

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

ExtPrivkey * __thiscall
cfd::core::ExtPrivkey::DerivePrivkey
          (ExtPrivkey *__return_storage_ptr__,ExtPrivkey *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path)

{
  uint32_t *child_path;
  _Alloc_hider _Var1;
  CfdException *pCVar2;
  value_type_conflict *__val;
  int ret;
  ext_key extkey;
  ext_key child_key;
  int local_22c;
  string local_228;
  ByteData256 local_208;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c0;
  ext_key local_1a8;
  ext_key local_e8;
  
  ByteData::GetBytes(&local_1c0,&this->serialize_data_);
  local_22c = bip32_key_unserialize
                        (local_1c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (long)local_1c0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1c0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,&local_1a8);
  if (local_22c != 0) {
    local_228._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
    local_228._M_string_length = CONCAT44(local_228._M_string_length._4_4_,0x274);
    local_228.field_2._M_allocated_capacity = (long)"KeyData::DerivePrivkey" + 9;
    logger::log<int&>((CfdSourceLocation *)&local_228,kCfdLogLevelWarning,
                      "bip32_key_unserialize error. ret={}",&local_22c);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,"ExtPrivkey unserialize error.","");
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_228);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_228,&this->tweak_sum_);
  local_1a8.pub_key_tweak_sum._0_8_ = *(undefined8 *)local_228._M_dataplus._M_p;
  local_1a8.pub_key_tweak_sum._8_8_ = *(undefined8 *)(local_228._M_dataplus._M_p + 8);
  local_1a8.pub_key_tweak_sum._16_8_ = *(undefined8 *)(local_228._M_dataplus._M_p + 0x10);
  local_1a8.pub_key_tweak_sum._24_8_ = *(undefined8 *)(local_228._M_dataplus._M_p + 0x18);
  operator_delete(local_228._M_dataplus._M_p);
  child_path = (path->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
  local_22c = bip32_key_from_parent_path
                        (&local_1a8,child_path,
                         (long)(path->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)child_path >> 2,4,
                         &local_e8);
  if (local_22c == 0) {
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x4e);
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x4e;
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3e] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3f] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x40] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x41] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x42] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x43] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x44] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x45] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x46] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x47] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x48] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x49] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x4a] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x4b] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x4c] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x4d] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x30] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x31] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x32] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x33] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x34] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x35] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x36] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x37] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x38] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x39] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3a] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3b] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3c] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3d] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3e] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x3f] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x20] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x21] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x22] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x23] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x24] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x25] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x26] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x27] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x28] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x29] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x2a] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x2b] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x2c] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x2d] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x2e] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x2f] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x10] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x11] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x12] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x13] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x14] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x15] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x16] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x17] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x18] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x19] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1a] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1b] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1c] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1d] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1e] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0x1f] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[2] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[3] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[4] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[5] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[6] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[7] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[8] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[9] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[10] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xb] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xc] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xd] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xe] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[0xf] = '\0';
    local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_22c = bip32_key_serialize(&local_e8,0,
                                    local_1f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,0x4e);
    if (local_22c == 0) {
      ByteData256::ByteData256((ByteData256 *)&local_228);
      local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
      local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x20;
      *(undefined8 *)
       (local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start + 0x10) = local_1a8.pub_key_tweak_sum._16_8_;
      *(undefined8 *)
       (local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start + 0x18) = local_1a8.pub_key_tweak_sum._24_8_;
      *(undefined8 *)
       local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start = local_1a8.pub_key_tweak_sum._0_8_;
      *(undefined8 *)
       (local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start + 8) = local_1a8.pub_key_tweak_sum._8_8_;
      local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      ByteData256::ByteData256(&local_208,&local_1d8);
      _Var1._M_p = local_228._M_dataplus._M_p;
      local_228._M_dataplus._M_p =
           (pointer)local_208.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_228._M_string_length =
           (size_type)
           local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
      local_228.field_2._M_allocated_capacity =
           (size_type)
           local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((uchar *)_Var1._M_p != (uchar *)0x0) {
        operator_delete(_Var1._M_p);
        if (local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_208.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      ByteData::ByteData((ByteData *)&local_208,&local_1f0);
      ExtPrivkey(__return_storage_ptr__,(ByteData *)&local_208,(ByteData256 *)&local_228);
      if (local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_228._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      if (local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_1f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_1c0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    local_228._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
    local_228._M_string_length = CONCAT44(local_228._M_string_length._4_4_,0x28c);
    local_228.field_2._M_allocated_capacity = (long)"KeyData::DerivePrivkey" + 9;
    logger::log<int&>((CfdSourceLocation *)&local_228,kCfdLogLevelWarning,
                      "bip32_key_serialize error. ret={}",&local_22c);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,"ExtPrivkey serialize error.","");
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_228);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_228._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
  local_228._M_string_length = CONCAT44(local_228._M_string_length._4_4_,0x284);
  local_228.field_2._M_allocated_capacity = (long)"KeyData::DerivePrivkey" + 9;
  logger::log<int&>((CfdSourceLocation *)&local_228,kCfdLogLevelWarning,
                    "bip32_key_from_parent_path error. ret={}",&local_22c);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,"ExtPrivkey derive error.","");
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_228);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey ExtPrivkey::DerivePrivkey(const std::vector<uint32_t>& path) const {
  struct ext_key extkey;
  struct ext_key child_key;

  const std::vector<uint8_t>& serialize_data = serialize_data_.GetBytes();
  int ret = bip32_key_unserialize(
      serialize_data.data(), serialize_data.size(), &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_unserialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey unserialize error.");
  }

#ifndef CFD_DISABLE_ELEMENTS
  // write pub_key_tweak_sum to ext_key
  memcpy(
      extkey.pub_key_tweak_sum, tweak_sum_.GetBytes().data(),
      sizeof(extkey.pub_key_tweak_sum));
#endif  // CFD_DISABLE_ELEMENTS
  uint32_t flag = BIP32_FLAG_KEY_PRIVATE;
  ret = bip32_key_from_parent_path(
      &extkey, path.data(), path.size(), flag | BIP32_FLAG_KEY_TWEAK_SUM,
      &child_key);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_from_parent_path error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey derive error.");
  }

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(&child_key, flag, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }

  ByteData256 tweak_sum_data;
#ifndef CFD_DISABLE_ELEMENTS
  // collect pub_key_tweak_sum from ext_key
  std::vector<uint8_t> tweak_sum(sizeof(extkey.pub_key_tweak_sum));
  memcpy(tweak_sum.data(), extkey.pub_key_tweak_sum, tweak_sum.size());
  tweak_sum_data = ByteData256(tweak_sum);
#endif  // CFD_DISABLE_ELEMENTS
  return ExtPrivkey(ByteData(data), tweak_sum_data);
}